

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O1

ion_bpp_err_t readDisk(ion_bpp_handle_t handle,ion_bpp_address_t adr,ion_bpp_buffer_t **b)

{
  ion_err_t iVar1;
  ion_bpp_err_t iVar2;
  ion_bpp_buffer_t *in_RAX;
  uint num_bytes;
  ion_bpp_buffer_t *buf;
  ion_bpp_buffer_t *local_28;
  
  local_28 = in_RAX;
  iVar2 = assignBuf(handle,adr,&local_28);
  if (iVar2 == bErrOk) {
    if (local_28->valid == boolean_false) {
      num_bytes = *(uint *)((long)handle + 0x10) * 3;
      if (adr != 0) {
        num_bytes = *(uint *)((long)handle + 0x10);
      }
      iVar1 = ion_fread_at(*handle,adr,num_bytes,(ion_byte_t *)local_28->p);
      if (iVar1 == '\0') {
        local_28->valid = boolean_true;
        local_28->modified = boolean_false;
        local_28->valid = boolean_true;
        local_28->modified = boolean_false;
        nDiskReads = nDiskReads + 2;
      }
      else if (bErrLineNo == 0) {
        bErrLineNo = 0x16e;
      }
      if (iVar1 != '\0') {
        return bErrIO;
      }
    }
    *b = local_28;
    iVar2 = bErrOk;
  }
  return iVar2;
}

Assistant:

static ion_bpp_err_t
readDisk(
	ion_bpp_handle_t	handle,
	ion_bpp_address_t	adr,
	ion_bpp_buffer_t	**b
) {
	ion_bpp_h_node_t *h = handle;
	/* read data into buf */
	int					len;
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_err_t		rc;			/* return code */

	if ((rc = assignBuf(handle, adr, &buf)) != 0) {
		return rc;
	}

	if (!buf->valid) {
		len = h->sectorSize;

		if (adr == 0) {
			len *= 3;	/* root */
		}

		ion_err_t err = ion_fread_at(h->fp, adr, len, (ion_byte_t *) buf->p);

		if (err_ok != err) {
			return error(bErrIO);
		}

		buf->modified	= boolean_false;
		buf->valid		= boolean_true;
		nDiskReads++;

#if 0
		len = 1;

		if (adr == 0) {
			len = 3;/* root */
		}

		if (0 != fseek(h->fp, buf->adr, SEEK_SET)) {
			return error(bErrIO);
		}

		for (i = 0; i < len; i++) {
			if (1 != fread(&buf[i].p->leaf, sizeof(buf->p->leaf), 1, h->fp)) {
				return error(bErrIO);
			}

			if (1 != fread(&buf[i].p->ct, sizeof(buf->p->ct), 1, h->fp)) {
				return error(bErrIO);
			}

			if (1 != fread(&buf[i].p->prev, sizeof(buf->p->prev), 1, h->fp)) {
				return error(bErrIO);
			}

			if (1 != fread(&buf[i].p->next, sizeof(buf->p->next), 1, h->fp)) {
				return error(bErrIO);
			}

			if (1 != fread(&buf[i].p->childLT, sizeof(buf->p->childLT), 1, h->fp)) {
				return error(bErrIO);
			}

			if (1 != fread(&buf[i].p->fkey, sizeof(buf->p->fkey), 1, h->fp)) {
				return error(bErrIO);
			}
		}

#endif

		buf->modified	= boolean_false;
		buf->valid		= boolean_true;
		nDiskReads++;
	}

	*b = buf;
	return bErrOk;
}